

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputFile.cpp
# Opt level: O3

OutputFile * OutputFile::allocKeyVal(string *key_arg,string *value_arg)

{
  OutputFile *this;
  
  this = (OutputFile *)operator_new(0xd8);
  OutputFile(this);
  std::__cxx11::string::_M_assign((string *)&this->key);
  std::__cxx11::string::_M_assign((string *)&this->value);
  return this;
}

Assistant:

OutputFile * OutputFile::allocKeyVal(const std::string & key_arg, const std::string & value_arg) {
  OutputFile * of = new OutputFile();
  of->setKeyValue(key_arg, value_arg);
  return of;
}